

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directional_light.h
# Opt level: O3

void __thiscall
CMU462::DynamicScene::DirectionalLight::DirectionalLight
          (DirectionalLight *this,LightInfo *light_info,Matrix4x4 *transform)

{
  undefined1 auVar1 [16];
  float fVar2;
  double dVar3;
  double local_78;
  double dStack_70;
  double local_68;
  Vector4D local_58;
  Vector4D local_38;
  
  (this->super_SceneLight)._vptr_SceneLight = (_func_int **)&PTR_get_static_light_00277318;
  (this->spectrum).r = 0.0;
  (this->spectrum).g = 0.0;
  (this->spectrum).b = 0.0;
  (this->direction).x = 0.0;
  (this->direction).y = 0.0;
  (this->direction).z = 0.0;
  (this->spectrum).b = (light_info->spectrum).b;
  fVar2 = (light_info->spectrum).g;
  (this->spectrum).r = (light_info->spectrum).r;
  (this->spectrum).g = fVar2;
  local_58.x = (light_info->direction).x;
  local_58.y = (light_info->direction).y;
  local_58.z = (light_info->direction).z;
  local_58.w = 1.0;
  Matrix4x4::operator*(transform,&local_58);
  Vector4D::to3D(&local_38);
  dVar3 = 1.0 / SQRT(local_68 * local_68 + local_78 * local_78 + dStack_70 * dStack_70);
  auVar1._8_4_ = SUB84(dVar3 * -dStack_70,0);
  auVar1._0_8_ = dVar3 * -local_78;
  auVar1._12_4_ = (int)((ulong)(dVar3 * -dStack_70) >> 0x20);
  (this->direction).x = dVar3 * -local_78;
  (this->direction).y = (double)auVar1._8_8_;
  (this->direction).z = dVar3 * -local_68;
  return;
}

Assistant:

DirectionalLight(const Collada::LightInfo& light_info,
                   const Matrix4x4& transform) {
    this->spectrum = light_info.spectrum;
    this->direction = -(transform * Vector4D(light_info.direction, 1)).to3D();
    this->direction.normalize();
  }